

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccnr.cc
# Opt level: O0

void __thiscall CCNR::ls_solver::flip(ls_solver *this,int flipv)

{
  char cVar1;
  undefined8 uVar2;
  bool bVar3;
  reference pvVar4;
  reference pvVar5;
  size_type sVar6;
  reference plVar7;
  long lVar8;
  int in_ESI;
  long in_RDI;
  lit lc_2;
  iterator __end5;
  iterator __begin5;
  vector<CCNR::lit,_std::allocator<CCNR::lit>_> *__range5;
  lit lc_1;
  iterator __end4_1;
  iterator __begin4_1;
  vector<CCNR::lit,_std::allocator<CCNR::lit>_> *__range4_1;
  lit lc;
  iterator __end4;
  iterator __begin4;
  vector<CCNR::lit,_std::allocator<CCNR::lit>_> *__range4;
  clause *cp;
  lit l;
  iterator __end1;
  iterator __begin1;
  vector<CCNR::lit,_std::allocator<CCNR::lit>_> *__range1;
  int org_flipv_score;
  vector<CCNR::lit,_std::allocator<CCNR::lit>_> *in_stack_ffffffffffffff08;
  __normal_iterator<CCNR::lit_*,_std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>_>
  *in_stack_ffffffffffffff10;
  longlong lVar9;
  uint local_b8;
  int the_clause;
  ls_solver *in_stack_ffffffffffffff50;
  __normal_iterator<CCNR::lit_*,_std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>_> local_a0;
  reference local_98;
  undefined8 local_90;
  size_type local_88;
  lit *local_80;
  __normal_iterator<CCNR::lit_*,_std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>_> local_78;
  reference local_70;
  undefined8 local_68;
  size_type local_60;
  lit *local_58;
  __normal_iterator<CCNR::lit_*,_std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>_> local_50;
  reference local_48;
  reference local_40;
  undefined8 local_38;
  size_t local_30;
  lit *local_28;
  __normal_iterator<CCNR::lit_*,_std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>_> local_20;
  reference local_18;
  int local_10;
  int local_c;
  
  local_c = in_ESI;
  pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)(in_RDI + 0xe0),(long)in_ESI);
  cVar1 = *pvVar4;
  pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)(in_RDI + 0xe0),(long)local_c);
  *pvVar4 = '\x01' - cVar1;
  pvVar5 = std::vector<CCNR::variable,_std::allocator<CCNR::variable>_>::operator[]
                     ((vector<CCNR::variable,_std::allocator<CCNR::variable>_> *)(in_RDI + 0x20),
                      (long)local_c);
  local_10 = (int)pvVar5->score;
  pvVar5 = std::vector<CCNR::variable,_std::allocator<CCNR::variable>_>::operator[]
                     ((vector<CCNR::variable,_std::allocator<CCNR::variable>_> *)(in_RDI + 0x20),
                      (long)local_c);
  sVar6 = std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>::size(&pvVar5->literals);
  *(size_type *)(in_RDI + 0x128) = sVar6 + *(long *)(in_RDI + 0x128);
  local_18 = std::vector<CCNR::variable,_std::allocator<CCNR::variable>_>::operator[]
                       ((vector<CCNR::variable,_std::allocator<CCNR::variable>_> *)(in_RDI + 0x20),
                        (long)local_c);
  local_20._M_current =
       (lit *)std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>::begin(in_stack_ffffffffffffff08);
  local_28 = (lit *)std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>::end
                              (in_stack_ffffffffffffff08);
  do {
    uVar2 = _local_b8;
    bVar3 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff10,
                       (__normal_iterator<CCNR::lit_*,_std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>_>
                        *)in_stack_ffffffffffffff08);
    the_clause = (int)((ulong)_local_b8 >> 0x20);
    if (!bVar3) {
      lVar8 = (long)-local_10;
      pvVar5 = std::vector<CCNR::variable,_std::allocator<CCNR::variable>_>::operator[]
                         ((vector<CCNR::variable,_std::allocator<CCNR::variable>_> *)(in_RDI + 0x20)
                          ,(long)local_c);
      pvVar5->score = lVar8;
      lVar9 = *(longlong *)(in_RDI + 0x120);
      pvVar5 = std::vector<CCNR::variable,_std::allocator<CCNR::variable>_>::operator[]
                         ((vector<CCNR::variable,_std::allocator<CCNR::variable>_> *)(in_RDI + 0x20)
                          ,(long)local_c);
      pvVar5->last_flip_step = lVar9;
      update_cc_after_flip(in_stack_ffffffffffffff50,the_clause);
      return;
    }
    plVar7 = __gnu_cxx::
             __normal_iterator<CCNR::lit_*,_std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>_>::
             operator*(&local_20);
    local_38 = *(undefined8 *)plVar7;
    local_30 = plVar7->var_num;
    local_40 = std::vector<CCNR::clause,_std::allocator<CCNR::clause>_>::operator[]
                         ((vector<CCNR::clause,_std::allocator<CCNR::clause>_> *)(in_RDI + 0x38),
                          (long)((int)(uint)local_38 >> 1));
    pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)(in_RDI + 0xe0),(long)local_c);
    _local_b8 = uVar2;
    if ((int)*pvVar4 == ((uint)local_38 & 1)) {
      local_40->sat_count = local_40->sat_count + 1;
      if (local_40->sat_count == 1) {
        sat_a_clause(in_stack_ffffffffffffff50,the_clause);
        local_40->sat_var = local_c;
        local_48 = local_40;
        local_50._M_current =
             (lit *)std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>::begin
                              (in_stack_ffffffffffffff08);
        local_58 = (lit *)std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>::end
                                    (in_stack_ffffffffffffff08);
        while (bVar3 = __gnu_cxx::operator!=
                                 (in_stack_ffffffffffffff10,
                                  (__normal_iterator<CCNR::lit_*,_std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>_>
                                   *)in_stack_ffffffffffffff08), bVar3) {
          plVar7 = __gnu_cxx::
                   __normal_iterator<CCNR::lit_*,_std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>_>
                   ::operator*(&local_50);
          local_68 = *(undefined8 *)plVar7;
          local_60 = plVar7->var_num;
          lVar8 = local_40->weight;
          pvVar5 = std::vector<CCNR::variable,_std::allocator<CCNR::variable>_>::operator[]
                             ((vector<CCNR::variable,_std::allocator<CCNR::variable>_> *)
                              (in_RDI + 0x20),local_60);
          pvVar5->score = pvVar5->score - lVar8;
          __gnu_cxx::
          __normal_iterator<CCNR::lit_*,_std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>_>::
          operator++(&local_50);
        }
      }
      else if (local_40->sat_count == 2) {
        lVar8 = local_40->weight;
        pvVar5 = std::vector<CCNR::variable,_std::allocator<CCNR::variable>_>::operator[]
                           ((vector<CCNR::variable,_std::allocator<CCNR::variable>_> *)
                            (in_RDI + 0x20),(long)local_40->sat_var);
        pvVar5->score = lVar8 + pvVar5->score;
      }
    }
    else {
      local_40->sat_count = local_40->sat_count + -1;
      if (local_40->sat_count == 0) {
        unsat_a_clause(in_stack_ffffffffffffff50,the_clause);
        local_70 = local_40;
        local_78._M_current =
             (lit *)std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>::begin
                              (in_stack_ffffffffffffff08);
        local_80 = (lit *)std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>::end
                                    (in_stack_ffffffffffffff08);
        while (bVar3 = __gnu_cxx::operator!=
                                 (in_stack_ffffffffffffff10,
                                  (__normal_iterator<CCNR::lit_*,_std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>_>
                                   *)in_stack_ffffffffffffff08), bVar3) {
          plVar7 = __gnu_cxx::
                   __normal_iterator<CCNR::lit_*,_std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>_>
                   ::operator*(&local_78);
          local_90 = *(undefined8 *)plVar7;
          local_88 = plVar7->var_num;
          lVar8 = local_40->weight;
          pvVar5 = std::vector<CCNR::variable,_std::allocator<CCNR::variable>_>::operator[]
                             ((vector<CCNR::variable,_std::allocator<CCNR::variable>_> *)
                              (in_RDI + 0x20),local_88);
          pvVar5->score = lVar8 + pvVar5->score;
          __gnu_cxx::
          __normal_iterator<CCNR::lit_*,_std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>_>::
          operator++(&local_78);
        }
      }
      else if (local_40->sat_count == 1) {
        local_98 = local_40;
        local_a0._M_current =
             (lit *)std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>::begin
                              (in_stack_ffffffffffffff08);
        std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>::end(in_stack_ffffffffffffff08);
        while (bVar3 = __gnu_cxx::operator!=
                                 (in_stack_ffffffffffffff10,
                                  (__normal_iterator<CCNR::lit_*,_std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>_>
                                   *)in_stack_ffffffffffffff08), bVar3) {
          plVar7 = __gnu_cxx::
                   __normal_iterator<CCNR::lit_*,_std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>_>
                   ::operator*(&local_a0);
          _local_b8 = *(undefined8 *)plVar7;
          in_stack_ffffffffffffff50 = (ls_solver *)plVar7->var_num;
          pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                             ((vector<char,_std::allocator<char>_> *)(in_RDI + 0xe0),
                              (size_type)in_stack_ffffffffffffff50);
          if ((int)*pvVar4 == (local_b8 & 1)) {
            lVar8 = local_40->weight;
            pvVar5 = std::vector<CCNR::variable,_std::allocator<CCNR::variable>_>::operator[]
                               ((vector<CCNR::variable,_std::allocator<CCNR::variable>_> *)
                                (in_RDI + 0x20),(size_type)in_stack_ffffffffffffff50);
            pvVar5->score = pvVar5->score - lVar8;
            local_40->sat_var = (int)in_stack_ffffffffffffff50;
            break;
          }
          __gnu_cxx::
          __normal_iterator<CCNR::lit_*,_std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>_>::
          operator++(&local_a0);
        }
      }
    }
    __gnu_cxx::__normal_iterator<CCNR::lit_*,_std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>_>::
    operator++(&local_20);
  } while( true );
}

Assistant:

void ls_solver::flip(int flipv)
{
    _solution[flipv] = 1 - _solution[flipv];
    int org_flipv_score = _vars[flipv].score;
    _mems += _vars[flipv].literals.size();
    for (lit l : _vars[flipv].literals) {
        clause *cp = &(_clauses[l.clause_num]);
        if (_solution[flipv] == l.sense) {
            cp->sat_count++;
            if (1 == cp->sat_count) {
                sat_a_clause(l.clause_num);
                cp->sat_var = flipv;
                for (lit lc : cp->literals) {
                    _vars[lc.var_num].score -= cp->weight;
                }
            } else if (2 == cp->sat_count) {
                _vars[cp->sat_var].score += cp->weight;
            }
        } else {
            cp->sat_count--;
            if (0 == cp->sat_count) {
                unsat_a_clause(l.clause_num);
                for (lit lc : cp->literals) {
                    _vars[lc.var_num].score += cp->weight;
                }
            } else if (1 == cp->sat_count) {
                for (lit lc : cp->literals) {
                    if (_solution[lc.var_num] == lc.sense) {
                        _vars[lc.var_num].score -= cp->weight;
                        cp->sat_var = lc.var_num;
                        break;
                    }
                }
            }
        }
    }
    _vars[flipv].score = -org_flipv_score;
    _vars[flipv].last_flip_step = _step;
    // update cc_values
    update_cc_after_flip(flipv);
}